

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Concat_x86::forward
          (Concat_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  Mat *this_00;
  uint uVar2;
  int iVar3;
  Mat *pMVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  size_t *psVar9;
  int *piVar10;
  void *pvVar11;
  int iVar12;
  size_t b_3;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  void *pvVar16;
  void *pvVar17;
  ulong uVar18;
  undefined4 *puVar19;
  int iVar20;
  long lVar21;
  size_t b;
  ulong uVar22;
  int iVar23;
  size_t sVar24;
  void *pvVar25;
  size_t b_2;
  pointer pMVar26;
  bool bVar27;
  int local_110;
  Mat top_blob_unpacked;
  Mat local_78;
  
  pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar2 = pMVar26->dims;
  iVar6 = *(int *)(&this->field_0xd0 + (long)this->_vptr_Concat_x86[-3]);
  if (uVar2 == 1) {
    lVar7 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48;
    piVar10 = &pMVar26->w;
    uVar14 = 0;
    while (bVar27 = lVar7 != 0, lVar7 = lVar7 + -1, bVar27) {
      uVar14 = uVar14 + piVar10[-5] * *piVar10;
      piVar10 = piVar10 + 0x12;
    }
    bVar5 = (uVar14 & 3) == 0 & opt->use_packing_layout;
    iVar20 = (uint)bVar5 + (uint)bVar5 * 2 + 1;
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,(int)uVar14 / iVar20,
                pMVar26->elemsize / (ulong)(long)pMVar26->elempack << bVar5 * '\x02',iVar20,
                opt->blob_allocator);
    pvVar25 = pMVar4->data;
    if (pvVar25 == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar4->c * pMVar4->cstep == 0) {
      return -100;
    }
    lVar7 = 0x2c;
    for (uVar22 = 0;
        pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar22 < (ulong)(((long)(bottom_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48);
        uVar22 = uVar22 + 1) {
      memcpy(pvVar25,*(void **)((long)pMVar26 + lVar7 + -0x2c),
             (long)*(int *)((long)&pMVar26->data + lVar7) * *(long *)((long)pMVar26 + lVar7 + -0x1c)
            );
      pvVar25 = (void *)((long)pvVar25 +
                        (long)*(int *)((long)pMVar26 + lVar7 + -0x14) *
                        (long)*(int *)((long)&pMVar26->data + lVar7) * 4);
      lVar7 = lVar7 + 0x48;
    }
  }
  iVar6 = (iVar6 >> 0x1f & uVar2) + iVar6;
  if ((uVar2 == 2) && (iVar6 == 0)) {
    iVar20 = pMVar26->w;
    sVar24 = pMVar26->elemsize;
    iVar15 = pMVar26->elempack;
    lVar7 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48;
    piVar10 = &pMVar26->h;
    uVar14 = 0;
    while (bVar27 = lVar7 != 0, lVar7 = lVar7 + -1, bVar27) {
      if (*(ulong *)(piVar10 + -8) < sVar24) {
        sVar24 = *(ulong *)(piVar10 + -8);
      }
      iVar12 = piVar10[-6];
      if (iVar12 < iVar15) {
        iVar15 = iVar12;
      }
      uVar14 = uVar14 + iVar12 * *piVar10;
      piVar10 = piVar10 + 0x12;
    }
    bVar5 = (uVar14 & 3) == 0 & opt->use_packing_layout;
    iVar12 = (uint)bVar5 + (uint)bVar5 * 2 + 1;
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,iVar20,(int)uVar14 / iVar12,sVar24 / (ulong)(long)iVar15 << bVar5 * '\x02',
                iVar12,opt->blob_allocator);
    if (pMVar4->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar4->c * pMVar4->cstep == 0) {
      return -100;
    }
    Mat::Mat(&top_blob_unpacked,pMVar4);
    if ((iVar12 <= iVar15) ||
       ((Mat::create(&top_blob_unpacked,iVar20,(int)uVar14 / iVar15,sVar24,iVar15,
                     opt->workspace_allocator), top_blob_unpacked.data != (void *)0x0 &&
        ((long)top_blob_unpacked.c * top_blob_unpacked.cstep != 0)))) {
      iVar23 = 0;
      if (0 < iVar20) {
        iVar23 = iVar20;
      }
      lVar7 = (long)(iVar20 * 4) * 4;
      pvVar25 = top_blob_unpacked.data;
      for (uVar22 = 0;
          pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start,
          uVar22 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48);
          uVar22 = uVar22 + 1) {
        pMVar1 = pMVar26 + uVar22;
        iVar3 = pMVar26[uVar22].elempack;
        if ((iVar3 == 4) && (iVar15 == 1)) {
          uVar8 = (ulong)(uint)pMVar1->h;
          if (pMVar1->h < 1) {
            uVar8 = 0;
          }
          pvVar11 = (void *)((long)(iVar20 * 3) * 4 + (long)pvVar25);
          pvVar16 = (void *)((long)(iVar20 * 2) * 4 + (long)pvVar25);
          pvVar17 = (void *)((long)iVar20 * 4 + (long)pvVar25);
          for (uVar18 = 0; uVar18 != uVar8; uVar18 = uVar18 + 1) {
            puVar19 = (undefined4 *)
                      ((long)pMVar1->w * uVar18 * pMVar1->elemsize + (long)pMVar1->data);
            for (lVar21 = 0; iVar23 != (int)lVar21; lVar21 = lVar21 + 1) {
              *(undefined4 *)((long)pvVar25 + lVar21 * 4) = *puVar19;
              *(undefined4 *)((long)pvVar17 + lVar21 * 4) = puVar19[1];
              *(undefined4 *)((long)pvVar16 + lVar21 * 4) = puVar19[2];
              *(undefined4 *)((long)pvVar11 + lVar21 * 4) = puVar19[3];
              puVar19 = puVar19 + 4;
            }
            pvVar25 = (void *)((long)pvVar25 + lVar7);
            pvVar11 = (void *)((long)pvVar11 + lVar7);
            pvVar16 = (void *)((long)pvVar16 + lVar7);
            pvVar17 = (void *)((long)pvVar17 + lVar7);
          }
        }
        if (iVar3 == iVar15) {
          lVar21 = (long)pMVar1->h * (long)iVar20;
          memcpy(pvVar25,pMVar1->data,pMVar1->elemsize * lVar21);
          pvVar25 = (void *)((long)pvVar25 + (long)(int)lVar21 * (long)pMVar1->elempack * 4);
        }
      }
      if (iVar15 < iVar12) {
        convert_packing(&top_blob_unpacked,pMVar4,iVar12,opt);
      }
      Mat::~Mat(&top_blob_unpacked);
      goto LAB_0014c8f7;
    }
LAB_0014cd81:
    Mat::~Mat(&top_blob_unpacked);
  }
  else {
LAB_0014c8f7:
    if ((uVar2 == 2) && (iVar6 == 1)) {
      pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar14 = pMVar26->h;
      sVar24 = pMVar26->elemsize;
      iVar20 = pMVar26->elempack;
      lVar7 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48;
      piVar10 = &pMVar26->w;
      iVar15 = 0;
      while (bVar27 = lVar7 != 0, lVar7 = lVar7 + -1, bVar27) {
        iVar15 = iVar15 + *piVar10;
        piVar10 = piVar10 + 0x12;
      }
      pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar4,iVar15,uVar14,sVar24,iVar20,opt->blob_allocator);
      if (pMVar4->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar4->c * pMVar4->cstep == 0) {
        return -100;
      }
      uVar8 = 0;
      uVar22 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar22 = uVar8;
      }
      for (; uVar8 != uVar22; uVar8 = uVar8 + 1) {
        pvVar25 = (void *)((long)pMVar4->w * uVar8 * pMVar4->elemsize + (long)pMVar4->data);
        lVar7 = 0x2c;
        for (uVar18 = 0;
            pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar18 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar26) /
                            0x48); uVar18 = uVar18 + 1) {
          lVar21 = (long)*(int *)((long)&pMVar26->data + lVar7);
          memcpy(pvVar25,(void *)(uVar8 * lVar21 * *(long *)((long)pMVar26 + lVar7 + -0x1c) +
                                 *(long *)((long)pMVar26 + lVar7 + -0x2c)),lVar21 * sVar24);
          pvVar25 = (void *)((long)pvVar25 +
                            (long)*(int *)((long)&pMVar26->data + lVar7) * (long)iVar20 * 4);
          lVar7 = lVar7 + 0x48;
        }
      }
    }
    if ((uVar2 == 3) && (iVar6 == 0)) {
      pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar20 = pMVar26->w;
      iVar15 = pMVar26->h;
      psVar9 = &pMVar26->elemsize;
      sVar24 = pMVar26->elemsize;
      local_110 = pMVar26->elempack;
      lVar7 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48;
      uVar14 = 0;
      while (bVar27 = lVar7 != 0, lVar7 = lVar7 + -1, bVar27) {
        if (*psVar9 < sVar24) {
          sVar24 = *psVar9;
        }
        iVar12 = *(int *)(psVar9 + 1);
        if (iVar12 < local_110) {
          local_110 = iVar12;
        }
        uVar14 = uVar14 + iVar12 * *(int *)(psVar9 + 5);
        psVar9 = psVar9 + 9;
      }
      bVar5 = (uVar14 & 3) == 0 & opt->use_packing_layout;
      iVar12 = (uint)bVar5 + (uint)bVar5 * 2 + 1;
      pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar4,iVar20,iVar15,(int)uVar14 / iVar12,
                  sVar24 / (ulong)(long)local_110 << bVar5 * '\x02',iVar12,opt->blob_allocator);
      if (pMVar4->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar4->c * pMVar4->cstep == 0) {
        return -100;
      }
      Mat::Mat(&top_blob_unpacked,pMVar4);
      if ((local_110 < iVar12) &&
         ((Mat::create(&top_blob_unpacked,iVar20,iVar15,(int)uVar14 / local_110,sVar24,local_110,
                       opt->workspace_allocator), top_blob_unpacked.data == (void *)0x0 ||
          ((long)top_blob_unpacked.c * top_blob_unpacked.cstep == 0)))) goto LAB_0014cd81;
      iVar20 = 0;
      for (uVar22 = 0;
          pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start,
          uVar22 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48);
          uVar22 = uVar22 + 1) {
        this_00 = pMVar26 + uVar22;
        iVar15 = pMVar26[uVar22].elempack;
        if ((iVar15 == 4) && (local_110 == 1)) {
          iVar15 = this_00->h * this_00->w;
          iVar23 = 0;
          if (iVar15 < 1) {
            iVar15 = iVar23;
          }
          while( true ) {
            if (this_00->c <= iVar23) break;
            Mat::channel(&local_78,this_00,iVar23);
            puVar19 = (undefined4 *)local_78.data;
            Mat::~Mat(&local_78);
            Mat::channel(&local_78,&top_blob_unpacked,iVar20);
            pvVar25 = local_78.data;
            Mat::~Mat(&local_78);
            Mat::channel(&local_78,&top_blob_unpacked,iVar20 + 1);
            pvVar11 = local_78.data;
            Mat::~Mat(&local_78);
            Mat::channel(&local_78,&top_blob_unpacked,iVar20 + 2);
            pvVar16 = local_78.data;
            Mat::~Mat(&local_78);
            Mat::channel(&local_78,&top_blob_unpacked,iVar20 + 3);
            pvVar17 = local_78.data;
            Mat::~Mat(&local_78);
            for (lVar7 = 0; iVar15 != (int)lVar7; lVar7 = lVar7 + 1) {
              *(undefined4 *)((long)pvVar25 + lVar7 * 4) = *puVar19;
              *(undefined4 *)((long)pvVar11 + lVar7 * 4) = puVar19[1];
              *(undefined4 *)((long)pvVar16 + lVar7 * 4) = puVar19[2];
              *(undefined4 *)((long)pvVar17 + lVar7 * 4) = puVar19[3];
              puVar19 = puVar19 + 4;
            }
            iVar20 = iVar20 + 4;
            iVar23 = iVar23 + 1;
          }
          iVar15 = this_00->elempack;
        }
        if (iVar15 == local_110) {
          sVar24 = this_00->cstep;
          iVar15 = this_00->c;
          pvVar25 = this_00->data;
          Mat::channel(&local_78,&top_blob_unpacked,iVar20);
          pvVar11 = local_78.data;
          Mat::~Mat(&local_78);
          memcpy(pvVar11,pvVar25,(long)((int)sVar24 * iVar15) * this_00->elemsize);
          iVar20 = iVar20 + this_00->c;
        }
      }
      if (local_110 < iVar12) {
        convert_packing(&top_blob_unpacked,pMVar4,iVar12,opt);
      }
      Mat::~Mat(&top_blob_unpacked);
    }
    if ((uVar2 == 3) && (iVar6 == 1)) {
      pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar20 = pMVar26->c;
      sVar24 = pMVar26->elemsize;
      iVar15 = pMVar26->elempack;
      lVar7 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48;
      piVar10 = &pMVar26->h;
      iVar12 = 0;
      while (bVar27 = lVar7 != 0, lVar7 = lVar7 + -1, bVar27) {
        iVar12 = iVar12 + *piVar10;
        piVar10 = piVar10 + 0x12;
      }
      pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar4,pMVar26->w,iVar12,iVar20,sVar24,iVar15,opt->blob_allocator);
      if (pMVar4->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar4->c * pMVar4->cstep == 0) {
        return -100;
      }
      iVar12 = 0;
      if (iVar20 < 1) {
        iVar20 = 0;
      }
      for (; iVar12 != iVar20; iVar12 = iVar12 + 1) {
        Mat::channel(&top_blob_unpacked,pMVar4,iVar12);
        pvVar25 = top_blob_unpacked.data;
        Mat::~Mat(&top_blob_unpacked);
        lVar7 = 0;
        for (uVar22 = 0;
            pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar22 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar26) /
                            0x48); uVar22 = uVar22 + 1) {
          lVar21 = (long)*(int *)((long)&pMVar26->h + lVar7) *
                   (long)*(int *)((long)&pMVar26->w + lVar7);
          Mat::channel(&top_blob_unpacked,(Mat *)((long)&pMVar26->data + lVar7),iVar12);
          pvVar11 = top_blob_unpacked.data;
          Mat::~Mat(&top_blob_unpacked);
          memcpy(pvVar25,pvVar11,lVar21 * sVar24);
          pvVar25 = (void *)((long)pvVar25 + (long)((int)lVar21 * iVar15) * 4);
          lVar7 = lVar7 + 0x48;
        }
      }
    }
    if (uVar2 != 3) {
      return 0;
    }
    if (iVar6 != 2) {
      return 0;
    }
    pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar2 = pMVar26->h;
    uVar14 = pMVar26->c;
    sVar24 = pMVar26->elemsize;
    iVar6 = pMVar26->elempack;
    lVar7 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar26) / 0x48;
    piVar10 = &pMVar26->w;
    iVar20 = 0;
    while (bVar27 = lVar7 != 0, lVar7 = lVar7 + -1, bVar27) {
      iVar20 = iVar20 + *piVar10;
      piVar10 = piVar10 + 0x12;
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,iVar20,uVar2,uVar14,sVar24,iVar6,opt->blob_allocator);
    if (pMVar4->data != (void *)0x0) {
      if ((long)pMVar4->c * pMVar4->cstep != 0) {
        uVar22 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar22 = 0;
        }
        uVar8 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar8 = 0;
        }
        for (iVar20 = 0; iVar20 != (int)uVar8; iVar20 = iVar20 + 1) {
          Mat::channel(&top_blob_unpacked,pMVar4,iVar20);
          pvVar25 = top_blob_unpacked.data;
          Mat::~Mat(&top_blob_unpacked);
          for (uVar18 = 0; uVar18 != uVar22; uVar18 = uVar18 + 1) {
            lVar7 = 0;
            for (uVar13 = 0;
                pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start,
                uVar13 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar26) /
                                0x48); uVar13 = uVar13 + 1) {
              Mat::channel(&top_blob_unpacked,(Mat *)((long)&pMVar26->data + lVar7),iVar20);
              pvVar11 = (void *)((long)top_blob_unpacked.w * uVar18 * top_blob_unpacked.elemsize +
                                (long)top_blob_unpacked.data);
              Mat::~Mat(&top_blob_unpacked);
              memcpy(pvVar25,pvVar11,(long)*(int *)((long)&pMVar26->w + lVar7) * sVar24);
              pvVar25 = (void *)((long)pvVar25 +
                                (long)*(int *)((long)&pMVar26->w + lVar7) * (long)iVar6 * 4);
              lVar7 = lVar7 + 0x48;
            }
          }
        }
        return 0;
      }
      return -100;
    }
  }
  return -100;
}

Assistant:

int Concat_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_w % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, bottom_blob.w * bottom_blob.elemsize);

            outptr += bottom_blob.w * bottom_blob.elempack;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_h += bottom_blob.h * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_h % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, top_h / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        float* outptr = top_blob_unpacked;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    outptr += w * 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8
            {
                int size = w * bottom_blob.h;

                const float* ptr = bottom_blob;
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                outptr += size * bottom_blob.elempack;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_channels += bottom_blob.c * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, h, top_channels / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        int p = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8
            {
                int size = bottom_blob.total();

                const float* ptr = bottom_blob;
                float* outptr = top_blob_unpacked.channel(p);
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                p += bottom_blob.c;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const float* ptr = bottom_blob.channel(q).row(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}